

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  size_t __n;
  long *plVar4;
  bool bVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  string local_name;
  string local_pname;
  undefined1 local_151;
  long *local_150;
  long local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  size_t local_128;
  long local_120 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  long *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string local_70;
  string local_50;
  
  if (name->_M_string_length < 3) {
    if ((name->_M_string_length != 2) || (*(name->_M_dataplus)._M_p != '-')) goto LAB_001357e6;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    if (*pcVar1 != '-') {
LAB_001357e6:
      sVar2 = (this->pname_)._M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (this->pname_)._M_dataplus._M_p;
        local_90 = local_80;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar3,pcVar3 + sVar2);
        local_130 = local_120;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar3,pcVar3 + name->_M_string_length);
        if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
          local_f0._M_current = &local_e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_90,local_88 + (long)local_90);
          local_151 = 0x5f;
          _Var7 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_f0,local_f0._M_current + local_e8,
                             (_Iter_equals_val<const_char>)&local_151);
          local_148 = (long)_Var7._M_current - (long)local_f0._M_current;
          *_Var7._M_current = '\0';
          if (local_f0._M_current == &local_e0) {
            uStack_138 = uStack_d8;
            local_150 = &local_140;
          }
          else {
            local_150 = (long *)local_f0._M_current;
          }
          local_140 = CONCAT71(uStack_df,local_e0);
          local_e8 = 0;
          local_e0 = 0;
          local_f0._M_current = &local_e0;
          ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_150);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_f0._M_current != &local_e0) {
            operator_delete(local_f0._M_current,CONCAT71(uStack_df,local_e0) + 1);
          }
          local_110._M_current = &local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_130,local_128 + (long)local_130);
          local_151 = 0x5f;
          _Var7 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_110,local_110._M_current + local_108,
                             (_Iter_equals_val<const_char>)&local_151);
          local_148 = (long)_Var7._M_current - (long)local_110._M_current;
          *_Var7._M_current = '\0';
          if (local_110._M_current == &local_100) {
            uStack_138 = uStack_f8;
            local_150 = &local_140;
          }
          else {
            local_150 = (long *)local_110._M_current;
          }
          local_140 = CONCAT71(uStack_ff,local_100);
          local_108 = 0;
          local_100 = 0;
          local_110._M_current = &local_100;
          ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_110._M_current != &local_100) {
            operator_delete(local_110._M_current,CONCAT71(uStack_ff,local_100) + 1);
          }
        }
        if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
          local_b0 = (long *)&local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_90,local_88 + (long)local_90);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_b0,(undefined1 *)((long)local_b0 + local_a8),local_b0);
          if (local_b0 == (long *)&local_a0) {
            uStack_138 = uStack_98;
            local_150 = &local_140;
          }
          else {
            local_150 = local_b0;
          }
          local_140 = CONCAT71(uStack_9f,local_a0);
          local_148 = local_a8;
          local_a8 = 0;
          local_a0 = 0;
          local_b0 = (long *)&local_a0;
          ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_150);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_b0 != (long *)&local_a0) {
            operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
          }
          local_d0 = (long *)&local_c0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_130,local_128 + (long)local_130);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_d0,(undefined1 *)((long)local_d0 + local_c8),local_d0);
          if (local_d0 == (long *)&local_c0) {
            uStack_138 = uStack_b8;
            local_150 = &local_140;
          }
          else {
            local_150 = local_d0;
          }
          local_140 = CONCAT71(uStack_bf,local_c0);
          local_148 = local_c8;
          local_c8 = 0;
          local_c0 = 0;
          local_d0 = (long *)&local_c0;
          ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_d0 != (long *)&local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
        }
        plVar4 = local_130;
        if (local_128 == local_88) {
          if (local_128 == 0) {
            bVar5 = false;
          }
          else {
            iVar6 = bcmp(local_130,local_90,local_128);
            bVar5 = iVar6 != 0;
          }
        }
        else {
          bVar5 = true;
        }
        if (plVar4 != local_120) {
          operator_delete(plVar4,local_120[0] + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (!bVar5) {
          return true;
        }
      }
      __n = (this->envname_)._M_string_length;
      if (__n == 0) {
        return false;
      }
      if (name->_M_string_length != __n) {
        return false;
      }
      iVar6 = bcmp((name->_M_dataplus)._M_p,(this->envname_)._M_dataplus._M_p,__n);
      return iVar6 == 0;
    }
    if (pcVar1[1] == '-') {
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
      bVar5 = check_lname(this,&local_50);
      local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return bVar5;
      }
      goto LAB_001357d9;
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
  bVar5 = check_sname(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return bVar5;
  }
LAB_001357d9:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return bVar5;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}